

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pAngle.cpp
# Opt level: O1

void __thiscall
OpenMD::pAngle::pAngle
          (pAngle *this,SimInfo *info,string *filename,string *sele1,int seleOffset,int nthetabins)

{
  SelectionEvaluator *this_00;
  pointer pcVar1;
  long *plVar2;
  pointer pOVar3;
  long lVar4;
  undefined1 local_90 [24];
  long lStack_78;
  SelectionEvaluator *local_70;
  SelectionManager *local_68;
  SelectionManager *local_60;
  string *local_58;
  string local_50;
  
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,nthetabins);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser = (_func_int **)&PTR__pAngle_0033b088;
  this->doVect_ = false;
  this->doOffset_ = true;
  this->doOffset2_ = false;
  local_58 = &this->selectionScript1_;
  (this->selectionScript1_)._M_dataplus._M_p = (pointer)&(this->selectionScript1_).field_2;
  pcVar1 = (sele1->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar1,pcVar1 + sele1->_M_string_length);
  (this->selectionScript2_)._M_dataplus._M_p = (pointer)&(this->selectionScript2_).field_2;
  (this->selectionScript2_)._M_string_length = 0;
  (this->selectionScript2_).field_2._M_local_buf[0] = '\0';
  local_60 = &this->seleMan1_;
  SelectionManager::SelectionManager(local_60,info);
  local_68 = &this->seleMan2_;
  SelectionManager::SelectionManager(local_68,info);
  this_00 = &this->evaluator1_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  local_70 = &this->evaluator2_;
  SelectionEvaluator::SelectionEvaluator(local_70,info);
  this->seleOffset_ = seleOffset;
  this->nThetaBins_ = nthetabins;
  (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getPrefix(&local_50,filename);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  pOVar3 = (pointer)(plVar2 + 2);
  if ((pointer)*plVar2 == pOVar3) {
    local_90._16_8_ =
         (pOVar3->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    lStack_78 = plVar2[3];
    local_90._0_8_ = (pointer)(local_90 + 0x10);
  }
  else {
    local_90._16_8_ =
         (pOVar3->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    local_90._0_8_ = (pointer)*plVar2;
  }
  local_90._8_8_ = plVar2[1];
  *plVar2 = (long)pOVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  if ((pointer)local_90._0_8_ != (pointer)(local_90 + 0x10)) {
    operator_delete((void *)local_90._0_8_,
                    (ulong)((long)&(((vector<bool,_std::allocator<bool>_> *)local_90._16_8_)->
                                   super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  SelectionEvaluator::loadScriptString(this_00,sele1);
  if ((this->evaluator1_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)local_90,this_00);
    lVar4 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan1_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar4),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((vector<bool,_std::allocator<bool>_> *)local_90._0_8_)->
                         super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar4));
      lVar4 = lVar4 + 0x28;
    } while (lVar4 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)local_90);
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->count_,(long)this->nThetaBins_);
  std::vector<double,_std::allocator<double>_>::resize(&this->histogram_,(long)this->nThetaBins_);
  return;
}

Assistant:

pAngle::pAngle(SimInfo* info, const std::string& filename,
                 const std::string& sele1, int seleOffset, int nthetabins) :
      StaticAnalyser(info, filename, nthetabins),
      doVect_(false), doOffset_(true), doOffset2_(false),
      selectionScript1_(sele1), seleMan1_(info), seleMan2_(info),
      evaluator1_(info), evaluator2_(info), seleOffset_(seleOffset),
      nThetaBins_(nthetabins) {
    setOutputName(getPrefix(filename) + ".pAngle");

    evaluator1_.loadScriptString(sele1);
    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    count_.resize(nThetaBins_);
    histogram_.resize(nThetaBins_);
  }